

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_rshift_fixed(mp_int *x,size_t bits)

{
  size_t sVar1;
  size_t sVar2;
  mp_int *r_00;
  mp_int *r;
  size_t nw;
  size_t words;
  size_t bits_local;
  mp_int *x_local;
  
  sVar2 = x->nw;
  sVar1 = size_t_min(x->nw,bits >> 6);
  sVar2 = size_t_max(sVar2 - sVar1,1);
  r_00 = mp_make_sized(sVar2);
  mp_rshift_fixed_into(r_00,x,bits);
  return r_00;
}

Assistant:

mp_int *mp_rshift_fixed(mp_int *x, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t nw = x->nw - size_t_min(x->nw, words);
    mp_int *r = mp_make_sized(size_t_max(nw, 1));
    mp_rshift_fixed_into(r, x, bits);
    return r;
}